

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void config_free(ConfigScanner *sc)

{
  ConfigItem *__ptr;
  SectionList *__ptr_00;
  ConfigItem *pCVar1;
  SectionList *pSVar2;
  
  if (sc != (ConfigScanner *)0x0) {
    pCVar1 = (ConfigItem *)&sc->first_item;
    __ptr = (ConfigItem *)0x0;
    while( true ) {
      pCVar1 = pCVar1->succ;
      free(__ptr);
      if (pCVar1 == (ConfigItem *)0x0) break;
      free(pCVar1->key);
      __ptr = pCVar1;
      if (pCVar1->vtype == VTYPE_STRING) {
        free((pCVar1->value).v_string);
      }
    }
    pSVar2 = (SectionList *)&sc->first_section;
    __ptr_00 = (SectionList *)0x0;
    while( true ) {
      pSVar2 = pSVar2->succ;
      free(__ptr_00);
      if (pSVar2 == (SectionList *)0x0) break;
      free(pSVar2->name);
      __ptr_00 = pSVar2;
    }
    free(sc->base);
    free(sc);
    return;
  }
  return;
}

Assistant:

void config_free(ConfigScanner *sc)
{
	if (sc == NULL)
	{
		return;
	}
	ConfigItem *c_item = sc->first_item;
	ConfigItem *c_prev = NULL;
	while (c_item != NULL)
	{
		if (c_prev)
		{
			free(c_prev);
		}
		if (c_item->key)
		{
			free(c_item->key);
		}
		if (c_item->vtype == VTYPE_STRING && c_item->value.v_string)
		{
			free(c_item->value.v_string);
		}
		c_prev = c_item;
		c_item = c_item->succ;
	}
	if (c_prev)
	{
		free(c_prev);
	}

	SectionList *s_item = sc->first_section;
	SectionList *s_prev = NULL;
	while (s_item != NULL)
	{
		if (s_prev)
		{
			free(s_prev);
		}
		if (s_item->name)
		{
			free(s_item->name);
		}
		s_prev = s_item;
		s_item = s_item->succ;
	}
	if (s_prev)
	{
		free(s_prev);
	}

	if (sc != NULL && sc->base != NULL)
	{
		free(sc->base);
	}

	if (sc != NULL)
	{
		free(sc);
	}
}